

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O1

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::file_progress_alert>
               (char *dst,char *src)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  
  *(undefined ***)dst = &PTR__alert_004ebb50;
  *(undefined8 *)(dst + 8) = *(undefined8 *)(src + 8);
  *(undefined ***)dst = &PTR__torrent_alert_004ebb90;
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(src + 0x10);
  *(undefined8 *)(dst + 0x18) = *(undefined8 *)(src + 0x18);
  src[0x10] = '\0';
  src[0x11] = '\0';
  src[0x12] = '\0';
  src[0x13] = '\0';
  src[0x14] = '\0';
  src[0x15] = '\0';
  src[0x16] = '\0';
  src[0x17] = '\0';
  src[0x18] = '\0';
  src[0x19] = '\0';
  src[0x1a] = '\0';
  src[0x1b] = '\0';
  src[0x1c] = '\0';
  src[0x1d] = '\0';
  src[0x1e] = '\0';
  src[0x1f] = '\0';
  *(undefined4 *)(dst + 0x28) = *(undefined4 *)(src + 0x28);
  *(undefined8 *)(dst + 0x20) = *(undefined8 *)(src + 0x20);
  *(undefined ***)dst = &PTR__file_progress_alert_004ed968;
  *(undefined8 *)(dst + 0x30) = *(undefined8 *)(src + 0x30);
  *(undefined8 *)(dst + 0x38) = *(undefined8 *)(src + 0x38);
  *(undefined8 *)(dst + 0x40) = *(undefined8 *)(src + 0x40);
  src[0x30] = '\0';
  src[0x31] = '\0';
  src[0x32] = '\0';
  src[0x33] = '\0';
  src[0x34] = '\0';
  src[0x35] = '\0';
  src[0x36] = '\0';
  src[0x37] = '\0';
  src[0x38] = '\0';
  src[0x39] = '\0';
  src[0x3a] = '\0';
  src[0x3b] = '\0';
  src[0x3c] = '\0';
  src[0x3d] = '\0';
  src[0x3e] = '\0';
  src[0x3f] = '\0';
  src[0x40] = '\0';
  src[0x41] = '\0';
  src[0x42] = '\0';
  src[0x43] = '\0';
  src[0x44] = '\0';
  src[0x45] = '\0';
  src[0x46] = '\0';
  src[0x47] = '\0';
  *(undefined ***)src = &PTR__torrent_alert_004ebb90;
  plVar2 = *(long **)(src + 0x18);
  if (plVar2 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar2 + 0xc);
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(int *)((long)plVar2 + 0xc);
      *(int *)((long)plVar2 + 0xc) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (**(code **)(*plVar2 + 0x18))();
    }
  }
  alert::~alert((alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}